

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64-decode.c
# Opt level: O3

int lws_b64_decode_stateful
              (lws_b64state *s,char *in,size_t *in_len,uint8_t *out,size_t *out_size,int final)

{
  int iVar1;
  size_t sVar2;
  byte *pbVar3;
  byte bVar4;
  byte *pbVar5;
  uint uVar6;
  ulong uVar7;
  char cVar8;
  uchar uVar9;
  int iVar10;
  byte *pbVar11;
  bool bVar12;
  
  pbVar3 = (byte *)(in + *in_len);
  sVar2 = *out_size;
  pbVar5 = out;
  pbVar11 = (byte *)in;
  do {
    do {
      if (((pbVar3 <= pbVar11) || (*pbVar11 == 0)) || (out + sVar2 <= pbVar5 + 4)) {
        *pbVar5 = 0;
        *in_len = (long)pbVar11 - (long)in;
        *out_size = (long)pbVar5 - (long)out;
        return 0;
      }
      iVar10 = s->i;
      if (iVar10 < 4) {
        do {
          if (*pbVar11 == 0) goto LAB_00136b89;
          s->c = 0;
          if (pbVar11 < pbVar3) {
            bVar4 = *pbVar11;
            if (bVar4 == 0) {
              bVar12 = true;
              cVar8 = '\0';
            }
            else {
              do {
                pbVar11 = pbVar11 + 1;
                uVar6 = (uint)bVar4;
                if (bVar4 == 0x2d) {
                  uVar6 = 0x2b;
                }
                if ((char)uVar6 == '_') {
                  uVar6 = 0x2f;
                }
                s->c = uVar6;
                if ((byte)((char)uVar6 + 0x85U) < 0xb0) {
LAB_00136b22:
                  cVar8 = '\0';
                }
                else {
                  if (("|$$$}rstuvwxyz{$$$$$$$>?@ABCDEFGHIJKLMNOPQRSTUVW$$$$$$XYZ[\\]^_`abcdefghijklmnopq"
                       [uVar6 - 0x2b] == '$') || (uVar6 - 0x2b == 0x50)) goto LAB_00136b22;
                  cVar8 = "|$$$}rstuvwxyz{$$$$$$$>?@ABCDEFGHIJKLMNOPQRSTUVW$$$$$$XYZ[\\]^_`abcdefghijklmnopq"
                          [uVar6 - 0x2b] + -0x3d;
                }
              } while (((pbVar11 < pbVar3) && (cVar8 == '\0')) && (bVar4 = *pbVar11, bVar4 != 0));
              bVar12 = (char)uVar6 == '\0';
            }
            if (bVar12) goto LAB_00136b52;
            s->len = s->len + 1;
            if (cVar8 != '\0') {
              uVar9 = cVar8 + 0xff;
              goto LAB_00136b55;
            }
          }
          else {
LAB_00136b52:
            uVar9 = '\0';
LAB_00136b55:
            s->quad[iVar10] = uVar9;
          }
          iVar1 = s->i;
          iVar10 = iVar1 + 1;
          s->i = iVar10;
          bVar12 = pbVar11 < pbVar3;
        } while ((bVar12) && (iVar1 < 3));
      }
      else {
LAB_00136b89:
        bVar12 = true;
      }
    } while ((final == 0) && (iVar10 != 4));
    s->i = 0;
    if (bVar12) {
      uVar7 = s->len;
      if (*pbVar11 == 0) goto LAB_00136bb6;
    }
    else {
      uVar7 = s->len;
LAB_00136bb6:
      if (s->c == 0x3d) {
        uVar7 = uVar7 - 1;
        s->len = uVar7;
      }
    }
    if (1 < uVar7) {
      *pbVar5 = s->quad[1] >> 4 | s->quad[0] << 2;
      uVar7 = s->len;
      if (uVar7 < 3) {
        pbVar5 = pbVar5 + 1;
      }
      else {
        pbVar5[1] = s->quad[2] >> 2 | s->quad[1] << 4;
        uVar7 = s->len;
        if (uVar7 < 4) {
          pbVar5 = pbVar5 + 2;
        }
        else {
          pbVar5[2] = s->quad[2] << 6 | s->quad[3];
          pbVar5 = pbVar5 + 3;
          uVar7 = s->len;
        }
      }
    }
    s->done = (s->done + uVar7) - 1;
    s->len = 0;
  } while( true );
}

Assistant:

int
lws_b64_decode_stateful(struct lws_b64state *s, const char *in, size_t *in_len,
			uint8_t *out, size_t *out_size, int final)
{
	const char *orig_in = in, *end_in = in + *in_len;
	uint8_t *orig_out = out, *end_out = out + *out_size;

	while (in < end_in && *in && out + 4 < end_out) {

		for (; s->i < 4 && in < end_in && *in; s->i++) {
			uint8_t v;

			v = 0;
			s->c = 0;
			while (in < end_in && *in && !v) {
				s->c = v = *in++;
				/* support the url base64 variant too */
				if (v == '-')
					s->c = v = '+';
				if (v == '_')
					s->c = v = '/';
				v = (v < 43 || v > 122) ? 0 : decode[v - 43];
				if (v)
					v = (v == '$') ? 0 : v - 61;
			}
			if (s->c) {
				s->len++;
				if (v)
					s->quad[s->i] = v - 1;
			} else
				s->quad[s->i] = 0;
		}

		if (s->i != 4 && !final)
			continue;

		s->i = 0;

		/*
		 * "The '==' sequence indicates that the last group contained
		 * only one byte, and '=' indicates that it contained two
		 * bytes." (wikipedia)
		 */

		if ((in >= end_in || !*in) && s->c == '=')
			s->len--;

		if (s->len >= 2)
			*out++ = s->quad[0] << 2 | s->quad[1] >> 4;
		if (s->len >= 3)
			*out++ = s->quad[1] << 4 | s->quad[2] >> 2;
		if (s->len >= 4)
			*out++ = ((s->quad[2] << 6) & 0xc0) | s->quad[3];

		s->done += s->len - 1;
		s->len = 0;
	}

	*out = '\0';
	*in_len = in - orig_in;
	*out_size = out - orig_out;

	return 0;
}